

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_visitor.cpp
# Opt level: O2

void __thiscall interpreter_visitor::visit(interpreter_visitor *this,Assignment *ptr)

{
  int *piVar1;
  string *this_00;
  allocator<char> local_21;
  
  (**(ptr->lvalue->super_Base)._vptr_Base)(ptr->lvalue,this);
  piVar1 = this->lvalue;
  if (piVar1 != (int *)0x0) {
    (**(ptr->rvalue->super_Base)._vptr_Base)(ptr->rvalue,this);
    *piVar1 = this->result;
    return;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>(this_00,"bad lvalue",&local_21);
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void interpreter_visitor::visit(Assignment* ptr) {

    ptr->lvalue->accept(this);
    if (lvalue == nullptr)
        throw std::string("bad lvalue");
    auto val_ptr = lvalue;
    ptr->rvalue->accept(this);
    *val_ptr = result;
}